

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_counted_base_clang.hpp
# Opt level: O2

int_least32_t boost::detail::atomic_conditional_increment(atomic_int_least32_t *pw)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = *pw;
  do {
    iVar1 = iVar2;
    if (iVar1 == 0) {
      return 0;
    }
    LOCK();
    iVar2 = *pw;
    bVar3 = iVar1 == iVar2;
    if (bVar3) {
      *pw = iVar1 + 1;
      iVar2 = iVar1;
    }
    UNLOCK();
  } while (!bVar3);
  return iVar1;
}

Assistant:

inline boost::int_least32_t atomic_conditional_increment( atomic_int_least32_t * pw )
{
    // long r = *pw;
    // if( r != 0 ) ++*pw;
    // return r;

    boost::int_least32_t r = __c11_atomic_load( pw, __ATOMIC_RELAXED );

    for( ;; )
    {
        if( r == 0 )
        {
            return r;
        }

        if( __c11_atomic_compare_exchange_weak( pw, &r, r + 1, __ATOMIC_RELAXED, __ATOMIC_RELAXED ) )
        {
            return r;
        }
    }    
}